

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::Write<tcu::Vector<unsigned_int,4>>
          (BasicAllTargetsStore *this,GLenum internalformat,Vector<unsigned_int,_4> *write_value,
          Vector<unsigned_int,_4> *expected_value)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLint GVar7;
  GLenum GVar8;
  char *src_fs;
  reference pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Vector<unsigned_int,_4> local_408;
  string local_3f8;
  Vector<unsigned_int,_4> local_3d8;
  string local_3c8;
  int local_3a4;
  int i_7;
  string local_390;
  Vector<unsigned_int,_4> local_370;
  string local_360;
  int local_33c;
  int i_6;
  string local_328;
  Vector<unsigned_int,_4> local_308;
  string local_2f8;
  int local_2d4;
  int i_5;
  string local_2c0;
  Vector<unsigned_int,_4> local_2a0;
  string local_290;
  int local_270;
  uint local_26c;
  int i_4;
  int face;
  string local_258;
  Vector<unsigned_int,_4> local_238;
  string local_228;
  int local_204;
  int i_3;
  string local_1f0;
  Vector<unsigned_int,_4> local_1d0;
  string local_1c0;
  int local_19c;
  int i_2;
  string local_188;
  Vector<unsigned_int,_4> local_168;
  string local_158;
  int local_134;
  int i_1;
  __normal_iterator<tcu::Vector<unsigned_int,_4>_*,_std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>_>
  local_120;
  __normal_iterator<tcu::Vector<unsigned_int,_4>_*,_std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>_>
  local_118;
  Vector<unsigned_int,_4> local_110;
  string local_100;
  Vector<unsigned_int,_4> local_e0;
  string local_d0;
  int local_b0;
  byte local_aa;
  allocator<tcu::Vector<unsigned_int,_4>_> local_a9;
  int i;
  bool status;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  int kSize;
  GLuint buffer;
  GLuint textures [8];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<unsigned_int,_4> *expected_value_local;
  Vector<unsigned_int,_4> *write_value_local;
  BasicAllTargetsStore *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsStore *this_local;
  
  pcStack_30 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._4_4_ = internalformat;
  pBStack_10 = this;
  GenFS<tcu::Vector<unsigned_int,4>>(&local_58,this,internalformat,write_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar4 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar4;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),8,(GLuint *)&kSize);
  glu::CallLogWrapper::glGenBuffers
            ((CallLogWrapper *)(this + 8),1,
             (GLuint *)
             ((long)&data.
                     super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  data.
  super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x10;
  std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator(&local_a9);
  std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::vector
            ((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&i,0x200,&local_a9);
  std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator(&local_a9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,kSize);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde0,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage1D
            ((CallLogWrapper *)(this + 8),0xde0,0,GVar8,0x10,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,buffer);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x806f,0,GVar8,0x10,0x10,2,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,textures[1]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x84f5,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x84f5,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,textures[2]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8516,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8515,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8518,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8517,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x851a,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8519,0,GVar8,0x10,0x10,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,0);
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)(this + 8),0x8c2a,
             data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x8c2a,0x100,pvVar9,0x88e8);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)(this + 8),0x8c2a,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,textures[3]);
  glu::CallLogWrapper::glTexBuffer
            ((CallLogWrapper *)(this + 8),0x8c2a,write_value_local._4_4_,
             data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,textures[4]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c18,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0x8c18,0,GVar8,0x10,2,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[5]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
  GVar8 = write_value_local._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glTexImage3D
            ((CallLogWrapper *)(this + 8),0x8c1a,0,GVar8,0x10,0x10,2,0,GVar5,GVar6,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,kSize,0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,buffer,0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,textures[0],0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[1],0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,textures[2],0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),5,textures[3],0,'\0',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),6,textures[4],0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),7,textures[5],0,'\x01',0,0x88b9,write_value_local._4_4_);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_1d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,0);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,1);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_3d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,2);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,3);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_cube");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,4);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,5);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,6);
  GVar7 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar7,7);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0x10,0x10);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  local_aa = 1;
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,kSize);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde0,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde0,0);
  for (local_b0 = 0; local_b0 < 0x10; local_b0 = local_b0 + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_b0);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_b0);
      tcu::Vector<unsigned_int,_4>::Vector(&local_e0,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_d0,(ShaderImageLoadStoreBase *)this,&local_e0);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector(&local_110,(Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_100,(ShaderImageLoadStoreBase *)this,&local_110);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n",uVar10,uVar11);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d0);
      break;
    }
  }
  local_118._M_current =
       (Vector<unsigned_int,_4> *)
       std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
       begin((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *
             )&i);
  local_120._M_current =
       (Vector<unsigned_int,_4> *)
       std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
       end((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           &i);
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&stack0xfffffffffffffed0,0);
  std::
  fill<__gnu_cxx::__normal_iterator<tcu::Vector<unsigned_int,4>*,std::vector<tcu::Vector<unsigned_int,4>,std::allocator<tcu::Vector<unsigned_int,4>>>>,tcu::Vector<unsigned_int,4>>
            (local_118,local_120,(Vector<unsigned_int,_4> *)&stack0xfffffffffffffed0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,buffer);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  for (local_134 = 0; local_134 < 0x100; local_134 = local_134 + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_134);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_134);
      tcu::Vector<unsigned_int,_4>::Vector(&local_168,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_158,(ShaderImageLoadStoreBase *)this,&local_168);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffe68,
                 (Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_188,(ShaderImageLoadStoreBase *)this,
                 (Vector<unsigned_int,_4> *)&stack0xfffffffffffffe68);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n",uVar10,uVar11);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_158);
      break;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x806f,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,0);
  for (local_19c = 0; local_19c < 0x200; local_19c = local_19c + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_19c);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_19c);
      tcu::Vector<unsigned_int,_4>::Vector(&local_1d0,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_1c0,(ShaderImageLoadStoreBase *)this,&local_1d0);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffe00,
                 (Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_1f0,(ShaderImageLoadStoreBase *)this,
                 (Vector<unsigned_int,_4> *)&stack0xfffffffffffffe00);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n",uVar10,uVar11);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1c0);
      break;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,textures[1]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x84f5,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x84f5,0);
  for (local_204 = 0; local_204 < 0x100; local_204 = local_204 + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_204);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_204);
      tcu::Vector<unsigned_int,_4>::Vector(&local_238,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_228,(ShaderImageLoadStoreBase *)this,&local_238);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&i_4,(Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_258,(ShaderImageLoadStoreBase *)this,(Vector<unsigned_int,_4> *)&i_4);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",uVar10,
                 uVar11);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_228);
      break;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,textures[2]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  for (local_26c = 0; (int)local_26c < 6; local_26c = local_26c + 1) {
    GVar8 = local_26c + 0x8515;
    GVar5 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                      ((ShaderImageLoadStoreBase *)this);
    GVar6 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                      ((ShaderImageLoadStoreBase *)this);
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
    glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),GVar8,0,GVar5,GVar6,pvVar9);
    for (local_270 = 0; local_270 < 0x100; local_270 = local_270 + 1) {
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_270);
      bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
      uVar1 = local_26c;
      if (!bVar3) {
        local_aa = 0;
        pvVar9 = std::
                 vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                               *)&i,(long)local_270);
        tcu::Vector<unsigned_int,_4>::Vector(&local_2a0,pvVar9);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                  (&local_290,(ShaderImageLoadStoreBase *)this,&local_2a0);
        uVar10 = std::__cxx11::string::c_str();
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffd30,
                   (Vector<unsigned_int,_4> *)src_vs);
        ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                  (&local_2c0,(ShaderImageLoadStoreBase *)this,
                   (Vector<unsigned_int,_4> *)&stack0xfffffffffffffd30);
        uVar11 = std::__cxx11::string::c_str();
        gl4cts::anon_unknown_0::Output
                  ("GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n"
                   ,(ulong)uVar1,uVar10,uVar11);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_290);
        break;
      }
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,textures[3]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c2a,0);
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)(this + 8),0x8c2a,
             data.
             super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetBufferSubData((CallLogWrapper *)(this + 8),0x8c2a,0,0x100,pvVar9);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)(this + 8),0x8c2a,0);
  for (local_2d4 = 0; local_2d4 < 0x10; local_2d4 = local_2d4 + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_2d4);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_2d4);
      tcu::Vector<unsigned_int,_4>::Vector(&local_308,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_2f8,(ShaderImageLoadStoreBase *)this,&local_308);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffcc8,
                 (Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_328,(ShaderImageLoadStoreBase *)this,
                 (Vector<unsigned_int,_4> *)&stack0xfffffffffffffcc8);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",uVar10,
                 uVar11);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::~string((string *)&local_2f8);
      break;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,textures[4]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x8c18,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c18,0);
  for (local_33c = 0; local_33c < 0x20; local_33c = local_33c + 1) {
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_33c);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_33c);
      tcu::Vector<unsigned_int,_4>::Vector(&local_370,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_360,(ShaderImageLoadStoreBase *)this,&local_370);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector
                ((Vector<unsigned_int,_4> *)&stack0xfffffffffffffc60,
                 (Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_390,(ShaderImageLoadStoreBase *)this,
                 (Vector<unsigned_int,_4> *)&stack0xfffffffffffffc60);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",uVar10,
                 uVar11);
      std::__cxx11::string::~string((string *)&local_390);
      std::__cxx11::string::~string((string *)&local_360);
      break;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[5]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  GVar8 = ShaderImageLoadStoreBase::Format<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<unsigned_int,4>>
                    ((ShaderImageLoadStoreBase *)this);
  pvVar9 = std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
           ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0x8c1a,0,GVar8,GVar5,pvVar9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  local_3a4 = 0;
  do {
    if (0x1ff < local_3a4) {
LAB_0105d67e:
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),8,(GLuint *)&kSize);
      glu::CallLogWrapper::glDeleteBuffers
                ((CallLogWrapper *)(this + 8),1,
                 (GLuint *)
                 ((long)&data.
                         super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      bVar2 = local_aa;
      std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
      ~vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               *)&i);
      return (bool)(bVar2 & 1);
    }
    pvVar9 = std::
             vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
             operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                         *)&i,(long)local_3a4);
    bVar3 = tcu::allEqual<unsigned_int,4>(pvVar9,(Vector<unsigned_int,_4> *)src_vs);
    if (!bVar3) {
      local_aa = 0;
      pvVar9 = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,(long)local_3a4);
      tcu::Vector<unsigned_int,_4>::Vector(&local_3d8,pvVar9);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_3c8,(ShaderImageLoadStoreBase *)this,&local_3d8);
      uVar10 = std::__cxx11::string::c_str();
      tcu::Vector<unsigned_int,_4>::Vector(&local_408,(Vector<unsigned_int,_4> *)src_vs);
      ShaderImageLoadStoreBase::ToString<tcu::Vector<unsigned_int,4>>
                (&local_3f8,(ShaderImageLoadStoreBase *)this,&local_408);
      uVar11 = std::__cxx11::string::c_str();
      gl4cts::anon_unknown_0::Output
                ("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",uVar10,
                 uVar11);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3c8);
      goto LAB_0105d67e;
    }
    local_3a4 = local_3a4 + 1;
  } while( true );
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS(internalformat, write_value).c_str());
		GLuint		 textures[8];
		GLuint		 buffer;
		glGenTextures(8, textures);
		glGenBuffers(1, &buffer);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 2);

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, internalformat, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(),
					 &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glBufferData(GL_TEXTURE_BUFFER, kSize * sizeof(T), &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glTexBuffer(GL_TEXTURE_BUFFER, internalformat, buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, internalformat, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image_buffer"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image_1darray"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image_2darray"), 7);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}
		std::fill(data.begin(), data.end(), T(0));

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_3D, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_3D target failed. Value is: %s. Value should be: %s.\n", ToString(data[i]).c_str(),
					   ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_RECTANGLE, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_RECTANGLE target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		{
			glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			for (int face = 0; face < 6; ++face)
			{
				glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
				for (int i = 0; i < kSize * kSize; ++i)
				{
					if (!tcu::allEqual(data[i], expected_value))
					{
						status = false;
						Output(
							"GL_TEXTURE_CUBE_MAP_POSITIVE_X + %d target failed. Value is: %s. Value should be: %s.\n",
							face, ToString(data[i]).c_str(), ToString(expected_value).c_str());
						break;
					}
				}
			}
			glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
		}

		glBindTexture(GL_TEXTURE_BUFFER, textures[5]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glBindTexture(GL_TEXTURE_BUFFER, 0);
		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glGetBufferSubData(GL_TEXTURE_BUFFER, 0, kSize * sizeof(T), &data[0]);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		for (int i = 0; i < kSize; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_BUFFER target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[6]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_1D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);
		for (int i = 0; i < kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_1D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		glGetTexImage(GL_TEXTURE_2D_ARRAY, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		for (int i = 0; i < kSize * kSize * 2; ++i)
		{
			if (!tcu::allEqual(data[i], expected_value))
			{
				status = false;
				Output("GL_TEXTURE_2D_ARRAY target failed. Value is: %s. Value should be: %s.\n",
					   ToString(data[i]).c_str(), ToString(expected_value).c_str());
				break;
			}
		}

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(8, textures);
		glDeleteBuffers(1, &buffer);

		return status;
	}